

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
HecrSequential_constructRhs_Test::~HecrSequential_constructRhs_Test
          (HecrSequential_constructRhs_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HecrSequential, constructRhs)
{
    int nx = 10;
    int nt = 10;
    int size = 15;
    vec prev_layer(size, -2.0);
    double t = 0.5;
    double end = -629.4555753109617372408285645;
    double mid = 19.0;
    const double expected_rhs_values[] =
        { end, mid, mid, mid, mid, mid, mid, mid, end, 0, 0, 0, 0, 0, 0 };
    vec expected_rhs = make_vector(size, expected_rhs_values);

    vec rhs = construct_rhs(nx, nt, prev_layer, t, f_test, u_test);

    EXPECT_EQ(size, rhs.size());
    EXPECT_LT(max_diff(expected_rhs, rhs), EPS);
}